

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function.cpp
# Opt level: O1

void Image_Function::ConvertTo16Bit
               (Image *in,uint32_t startXIn,uint32_t startYIn,Image16Bit *out,uint32_t startXOut,
               uint32_t startYOut,uint32_t width,uint32_t height)

{
  unsigned_short *puVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  imageException *this;
  unsigned_short *puVar5;
  uint uVar6;
  uchar *puVar7;
  long lVar8;
  long lVar9;
  
  ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (in,startXIn,startYIn,width,height);
  ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_short>>
            (out,startXOut,startYOut,width,height);
  bVar2 = in->_colorCount;
  if (bVar2 == out->_colorCount) {
    uVar3 = out->_rowSize;
    if (height * uVar3 != 0) {
      puVar5 = out->_data + (ulong)(startYOut * uVar3) + (ulong)(startXOut * bVar2);
      puVar1 = puVar5 + height * uVar3;
      uVar6 = width * bVar2;
      uVar4 = in->_rowSize;
      puVar7 = in->_data + (ulong)startXIn + (ulong)(startYIn * uVar4);
      do {
        if (uVar6 != 0) {
          lVar9 = 0;
          lVar8 = (ulong)uVar6 * 2;
          do {
            puVar5[lVar9] = (ushort)puVar7[lVar9] << 8;
            lVar9 = lVar9 + 1;
            lVar8 = lVar8 + -2;
          } while (lVar8 != 0);
        }
        puVar5 = puVar5 + uVar3;
        puVar7 = puVar7 + uVar4;
      } while (puVar5 != puVar1);
    }
    return;
  }
  this = (imageException *)__cxa_allocate_exception(0x28);
  imageException::imageException(this,"Color counts of images are different");
  __cxa_throw(this,&imageException::typeinfo,imageException::~imageException);
}

Assistant:

void ConvertTo16Bit( const Image & in, uint32_t startXIn, uint32_t startYIn, Image16Bit & out, uint32_t startXOut, uint32_t startYOut,
                         uint32_t width, uint32_t height )
    {
        ParameterValidation( in, startXIn, startYIn, width, height );
        ParameterValidation( out, startXOut, startYOut, width, height );
        if ( in.colorCount() != out.colorCount() )
            throw imageException( "Color counts of images are different" );

        const uint32_t rowSizeIn  = in.rowSize();
        const uint32_t rowSizeOut = out.rowSize();

        const uint8_t colorCount = in.colorCount();

        const uint8_t * inY  = in.data()  + startYIn  * rowSizeIn  + startXIn;
        uint16_t      * outY = out.data() + startYOut * rowSizeOut + startXOut * colorCount;

        const uint16_t * outYEnd = outY + height * rowSizeOut;

        width = width * colorCount;

        for ( ; outY != outYEnd; outY += rowSizeOut, inY += rowSizeIn ) {
            const uint8_t  * inX  = inY;
            uint16_t       * outX = outY;
            const uint16_t * outXEnd = outX + width;

            for ( ; outX != outXEnd; ++outX, ++inX )
                *outX = (*inX) << 8;
        }
    }